

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Serializer.cpp
# Opt level: O0

void __thiscall
adios2::format::BP3Serializer::AggregateCollectiveMetadata
          (BP3Serializer *this,Comm *comm,BufferSTL *bufferSTL,bool inMetadataBuffer)

{
  byte in_CL;
  long in_RDX;
  long *in_RDI;
  undefined1 unaff_retaddr;
  size_t *in_stack_00000008;
  vector<char,_std::allocator<char>_> *in_stack_00000010;
  uint64_t in_stack_00000018;
  uint64_t in_stack_00000020;
  uint64_t in_stack_00000028;
  BPSerializer *in_stack_00000030;
  int rank;
  vector<unsigned_long,_std::allocator<unsigned_long>_> indicesPosition;
  BufferSTL *in_stack_00000148;
  Comm *in_stack_00000150;
  BP3Serializer *in_stack_00000158;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  string *in_stack_fffffffffffffe88;
  IOChrono *in_stack_fffffffffffffe90;
  allocator local_111;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [36];
  int local_9c;
  string *in_stack_ffffffffffffff68;
  IOChrono *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  string local_78 [55];
  allocator local_41;
  string local_40 [39];
  byte local_19;
  long local_18;
  
  local_19 = in_CL & 1;
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"buffering",&local_41);
  profiling::IOChrono::Start(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"meta_sort_merge",(allocator *)&stack0xffffffffffffff87);
  profiling::IOChrono::Start(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
  AggregateCollectiveMetadataIndices(in_stack_00000158,in_stack_00000150,in_stack_00000148);
  local_9c = helper::Comm::Rank((Comm *)0xb35d14);
  if (local_9c == 0) {
    in_stack_fffffffffffffe90 = (IOChrono *)(in_RDI + 1);
    in_stack_fffffffffffffe88 = (string *)&stack0xffffffffffffff68;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe88,0)
    ;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe88,1)
    ;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe88,2)
    ;
    BPSerializer::PutMinifooter
              (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018,
               in_stack_00000010,in_stack_00000008,(bool)unaff_retaddr);
    if ((local_19 & 1) == 0) {
      *(long *)(local_18 + 0x38) = *(long *)(local_18 + 0x30) + *(long *)(local_18 + 0x38);
    }
    else {
      *(undefined8 *)(local_18 + 0x38) = *(undefined8 *)(local_18 + 0x30);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"after collective metadata is done",&local_c1);
  BufferSTL::Resize((BufferSTL *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                    (string *)in_stack_ffffffffffffff70);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
            ((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"meta_sort_merge",&local_e9);
  profiling::IOChrono::Stop(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,"buffering",&local_111);
  profiling::IOChrono::Stop(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(this_00);
  return;
}

Assistant:

void BP3Serializer::AggregateCollectiveMetadata(helper::Comm const &comm, BufferSTL &bufferSTL,
                                                const bool inMetadataBuffer)
{
    m_Profiler.Start("buffering");
    m_Profiler.Start("meta_sort_merge");

    const std::vector<size_t> indicesPosition = AggregateCollectiveMetadataIndices(comm, bufferSTL);

    int rank = comm.Rank();
    if (rank == 0)
    {
        PutMinifooter(static_cast<uint64_t>(indicesPosition[0]),
                      static_cast<uint64_t>(indicesPosition[1]),
                      static_cast<uint64_t>(indicesPosition[2]), bufferSTL.m_Buffer,
                      bufferSTL.m_Position, inMetadataBuffer);

        if (inMetadataBuffer)
        {
            bufferSTL.m_AbsolutePosition = bufferSTL.m_Position;
        }
        else
        {
            bufferSTL.m_AbsolutePosition += bufferSTL.m_Position;
        }
    }

    bufferSTL.Resize(bufferSTL.m_Position, "after collective metadata is done");

    m_Profiler.Stop("meta_sort_merge");
    m_Profiler.Stop("buffering");
}